

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * fts3HashMalloc(sqlite3_int64 n)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    pvVar2 = sqlite3Malloc(n);
    if (pvVar2 != (void *)0x0) {
      pvVar2 = memset(pvVar2,0,n);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *fts3HashMalloc(sqlite3_int64 n){
  void *p = sqlite3_malloc64(n);
  if( p ){
    memset(p, 0, n);
  }
  return p;
}